

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_helper_ssl.cpp
# Opt level: O1

void __thiscall license::CryptoHelperLinux::CryptoHelperLinux(CryptoHelperLinux *this)

{
  (this->super_CryptoHelper)._vptr_CryptoHelper = (_func_int **)&PTR_generateKeyPair_00542f18;
  this->m_pktmp = (EVP_PKEY *)0x0;
  if (CryptoHelperLinux()::initialized != '\0') {
    return;
  }
  CryptoHelperLinux()::initialized = 1;
  ERR_load_ERR_strings();
  OPENSSL_init_crypto(2,0);
  OPENSSL_init_crypto(0xc,0);
  return;
}

Assistant:

CryptoHelperLinux::CryptoHelperLinux() : m_pktmp(nullptr) {
	static int initialized = 0;
	if (initialized == 0) {
		initialized = 1;
		ERR_load_ERR_strings();
		ERR_load_crypto_strings();
		OpenSSL_add_all_algorithms();
	}
}